

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.cpp
# Opt level: O2

int __thiscall zmq::sub_t::xsetsockopt(sub_t *this,int option_,void *optval_,size_t optvallen_)

{
  int iVar1;
  int *piVar2;
  char *errmsg_;
  msg_t msg;
  
  if (option_ - 8U < 0xfffffffe) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  else {
    if (option_ == 6) {
      iVar1 = msg_t::init_subscribe(&msg,optvallen_,(uchar *)optval_);
    }
    else {
      iVar1 = msg_t::init_cancel(&msg,optvallen_,(uchar *)optval_);
    }
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      errmsg_ = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/sub.cpp"
              ,0x42);
      fflush(_stderr);
      zmq_abort(errmsg_);
    }
    iVar1 = xsub_t::xsend(&this->super_xsub_t,&msg);
    iVar1 = close_and_return(&msg,iVar1);
  }
  return iVar1;
}

Assistant:

int zmq::sub_t::xsetsockopt (int option_,
                             const void *optval_,
                             size_t optvallen_)
{
    if (option_ != ZMQ_SUBSCRIBE && option_ != ZMQ_UNSUBSCRIBE) {
        errno = EINVAL;
        return -1;
    }

    //  Create the subscription message.
    msg_t msg;
    int rc;
    const unsigned char *data = static_cast<const unsigned char *> (optval_);
    if (option_ == ZMQ_SUBSCRIBE) {
        rc = msg.init_subscribe (optvallen_, data);
    } else {
        rc = msg.init_cancel (optvallen_, data);
    }
    errno_assert (rc == 0);

    //  Pass it further on in the stack.
    rc = xsub_t::xsend (&msg);
    return close_and_return (&msg, rc);
}